

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall
QGraphicsItemPrivate::invalidateParentGraphicsEffectsRecursively(QGraphicsItemPrivate *this)

{
  uint uVar1;
  
  do {
    if ((this->graphicsEffect != (QGraphicsEffect *)0x0) &&
       (uVar1 = *(uint *)&this->field_0x168, *(uint *)&this->field_0x168 = uVar1 | 1,
       (uVar1 & 0x40) == 0)) {
      QGraphicsEffectSourcePrivate::invalidateCache
                (*(QGraphicsEffectSourcePrivate **)
                  (*(long *)(*(long *)&this->graphicsEffect->field_0x8 + 0x78) + 8),SourceChanged);
    }
  } while ((this->parent != (QGraphicsItem *)0x0) &&
          (this = (this->parent->d_ptr).d, this != (QGraphicsItemPrivate *)0x0));
  return;
}

Assistant:

void QGraphicsItemPrivate::invalidateParentGraphicsEffectsRecursively()
{
    QGraphicsItemPrivate *itemPrivate = this;
    do {
        if (itemPrivate->graphicsEffect) {
            itemPrivate->notifyInvalidated = 1;

            if (!itemPrivate->updateDueToGraphicsEffect)
                static_cast<QGraphicsItemEffectSourcePrivate *>(itemPrivate->graphicsEffect->d_func()->source->d_func())->invalidateCache();
        }
    } while ((itemPrivate = itemPrivate->parent ? itemPrivate->parent->d_ptr.data() : nullptr));
}